

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

int ssh1_rportfwd_cmp(void *av,void *bv)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(*(char **)((long)av + 0x10),*(char **)((long)bv + 0x10));
  if (iVar1 == 0) {
    uVar2 = 1;
    if (*(uint *)((long)av + 4) <= *(uint *)((long)bv + 4)) {
      uVar2 = -(uint)(*(uint *)((long)av + 4) < *(uint *)((long)bv + 4));
    }
  }
  else {
    uVar2 = iVar1 >> 0x1f | 1;
  }
  return uVar2;
}

Assistant:

static int ssh1_rportfwd_cmp(void *av, void *bv)
{
    struct ssh_rportfwd *a = (struct ssh_rportfwd *) av;
    struct ssh_rportfwd *b = (struct ssh_rportfwd *) bv;
    int i;
    if ( (i = strcmp(a->dhost, b->dhost)) != 0)
        return i < 0 ? -1 : +1;
    if (a->dport > b->dport)
        return +1;
    if (a->dport < b->dport)
        return -1;
    return 0;
}